

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O1

void __thiscall ear::ScreenEdgeLock::~ScreenEdgeLock(ScreenEdgeLock *this)

{
  type tVar1;
  type tVar2;
  
  if ((this->vertical).super_type.m_initialized == true) {
    tVar2 = (this->vertical).super_type.m_storage.dummy_.aligner_;
    tVar1 = (type)((long)&(this->vertical).super_type.m_storage.dummy_ + 0x10);
    if (tVar2 != tVar1) {
      operator_delete((void *)tVar2,*(long *)tVar1 + 1);
    }
    (this->vertical).super_type.m_initialized = false;
  }
  if ((this->horizontal).super_type.m_initialized == true) {
    tVar2 = (this->horizontal).super_type.m_storage.dummy_.aligner_;
    tVar1 = (type)((long)&(this->horizontal).super_type.m_storage.dummy_ + 0x10);
    if (tVar2 != tVar1) {
      operator_delete((void *)tVar2,*(long *)tVar1 + 1);
    }
    (this->horizontal).super_type.m_initialized = false;
  }
  return;
}

Assistant:

struct EAR_EXPORT ScreenEdgeLock {
    /// `screenEdgeLock` attribute on `position` element with
    /// `coordinate="azimuth"` or `coordinate="X"`
    boost::optional<std::string> horizontal;
    /// `screenEdgeLock` attribute on `position` element with
    /// `coordinate="elevation"` or `coordinate="Z"`
    boost::optional<std::string> vertical;
  }